

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vardata.c
# Opt level: O0

int vardata_add_mode(vardata *data,char *name,char *description,int modeset)

{
  int iVar1;
  vardata_mode *pvVar2;
  char *local_60;
  vardata_mode new;
  int res;
  int modeset_local;
  char *description_local;
  char *name_local;
  vardata *data_local;
  
  new._44_4_ = modeset;
  if (data->validated != 0) {
    abort();
  }
  iVar1 = symtab_put(data->symtab,name,3,data->modesnum);
  if (iVar1 == -1) {
    data_local._4_4_ = -1;
  }
  else {
    new.modeset = data->modesnum;
    memset(&local_60,0,0x30);
    local_60 = strdup(name);
    new.rfeaturesnum = new._44_4_;
    if (description != (char *)0x0) {
      new.name = strdup(description);
    }
    if (data->modesmax <= data->modesnum) {
      if (data->modesmax == 0) {
        data->modesmax = 0x10;
      }
      else {
        data->modesmax = data->modesmax << 1;
      }
      pvVar2 = (vardata_mode *)realloc(data->modes,(long)data->modesmax * 0x30);
      data->modes = pvVar2;
    }
    iVar1 = data->modesnum;
    data->modesnum = iVar1 + 1;
    memcpy(data->modes + iVar1,&local_60,0x30);
    data_local._4_4_ = new.modeset;
  }
  return data_local._4_4_;
}

Assistant:

int vardata_add_mode(struct vardata *data, const char *name, const char *description, int modeset) {
	if (data->validated)
		abort();
	if (symtab_put(data->symtab, name, VARDATA_ST_MODE, data->modesnum) == -1)
		return -1;
	int res = data->modesnum;
	struct vardata_mode new = { strdup(name), .modeset = modeset };
	if (description)
		new.description = strdup(description);
	ADDARRAY(data->modes, new);
	return res;
}